

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O1

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::read_exponent_and_suffix
          (ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
           *this)

{
  Position *this_00;
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  char *pcVar6;
  
  this_00 = &this->m_position;
  pcVar1 = (this->m_position).m_pos;
  if ((pcVar1 == (this->m_position).m_end) || (iVar3 = tolower((int)*pcVar1), iVar3 != 0x65))
  goto LAB_0033de41;
  Position::operator++(this_00);
  pcVar1 = (this->m_position).m_pos;
  pcVar2 = (this->m_position).m_end;
  if (pcVar1 != pcVar2) {
    if (*pcVar1 != '-') {
      pcVar6 = "";
      if (pcVar1 != pcVar2) {
        pcVar6 = pcVar1;
      }
      if (*pcVar6 != '+') goto LAB_0033de05;
    }
    Position::operator++(this_00);
  }
LAB_0033de05:
  pbVar5 = (byte *)(this->m_position).m_pos;
  pbVar4 = pbVar5;
  if (pbVar5 != (byte *)(this->m_position).m_end) {
    do {
      if (m_alphabet._M_elems[2]._M_elems[*pbVar4] != true) break;
      Position::operator++(this_00);
      pbVar4 = (byte *)(this->m_position).m_pos;
    } while (pbVar4 != (byte *)(this->m_position).m_end);
  }
  if (pbVar4 == pbVar5) {
    return false;
  }
LAB_0033de41:
  pbVar5 = (byte *)(this->m_position).m_pos;
  if (pbVar5 != (byte *)(this->m_position).m_end) {
    do {
      if (m_alphabet._M_elems[0xb]._M_elems[*pbVar5] != true) {
        return true;
      }
      Position::operator++(this_00);
      pbVar5 = (byte *)(this->m_position).m_pos;
    } while (pbVar5 != (byte *)(this->m_position).m_end);
  }
  return true;
}

Assistant:

bool read_exponent_and_suffix() noexcept {
        // Support a form of scientific notation: 1e-5, 35.5E+8, 0.01e19
        if (m_position.has_more() && (std::tolower(*m_position) == 'e')) {
          ++m_position;
          if (m_position.has_more() && ((*m_position == '-') || (*m_position == '+'))) {
            ++m_position;
          }
          auto exponent_pos = m_position;
          while (m_position.has_more() && char_in_alphabet(*m_position, detail::int_alphabet)) {
            ++m_position;
          }
          if (m_position == exponent_pos) {
            // Require at least one digit after the exponent
            return false;
          }
        }

        // Parse optional float suffix
        while (m_position.has_more() && char_in_alphabet(*m_position, detail::float_suffix_alphabet)) {
          ++m_position;
        }

        return true;
      }